

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O0

QMimeData * __thiscall
QPlainTextEditControl::createMimeDataFromSelection(QPlainTextEditControl *this)

{
  QPlainTextEdit *pQVar1;
  QWidgetTextControl *in_RDI;
  QPlainTextEdit *ed;
  QMimeData *local_8;
  
  QObject::parent((QObject *)0x6bfddc);
  pQVar1 = qobject_cast<QPlainTextEdit*>((QObject *)0x6bfde4);
  if (pQVar1 == (QPlainTextEdit *)0x0) {
    local_8 = QWidgetTextControl::createMimeDataFromSelection(in_RDI);
  }
  else {
    local_8 = (QMimeData *)
              (**(code **)(*(long *)&(pQVar1->super_QAbstractScrollArea).super_QFrame.super_QWidget
                          + 0x1d0))();
  }
  return local_8;
}

Assistant:

QMimeData *QPlainTextEditControl::createMimeDataFromSelection() const {
        QPlainTextEdit *ed = qobject_cast<QPlainTextEdit *>(parent());
        if (!ed)
            return QWidgetTextControl::createMimeDataFromSelection();
        return ed->createMimeDataFromSelection();
    }